

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::BitfieldReverseCase::compare
          (BitfieldReverseCase *this,void **inputs,void **outputs)

{
  char cVar1;
  pointer pSVar2;
  int iVar3;
  ostream *stream;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ostringstream *this_00;
  long lVar7;
  Hex<8UL> local_30;
  
  pSVar2 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_00987a80)[(ulong)(pSVar2->varType).m_data.basic.precision * 4];
  iVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  bVar4 = iVar3 < 1;
  if (0 < iVar3) {
    uVar5 = (2 << (cVar1 - 1U & 0x1f)) - 1;
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
    uVar5 = (uVar5 & 0xf0f0f0f) << 4 | uVar5 >> 4 & 0xf0f0f0f;
    uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333) * 4;
    lVar7 = 0;
    do {
      uVar6 = *(uint *)((long)*inputs + lVar7 * 4);
      uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      uVar6 = (uVar6 & 0xf0f0f0f) << 4 | uVar6 >> 4 & 0xf0f0f0f;
      uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333) * 4;
      uVar6 = (uVar6 >> 1 & 0x55555555) + (uVar6 & 0x55555555) * 2;
      if (((*(uint *)((long)*outputs + lVar7 * 4) ^ uVar6) &
          (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555) * 2) != 0) {
        this_00 = &(this->super_IntegerFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        stream = (ostream *)std::ostream::operator<<(this_00,(int)lVar7);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
        local_30.value = (deUint64)uVar6;
        tcu::Format::Hex<8UL>::toStream(&local_30,stream);
        return bVar4;
      }
      lVar7 = lVar7 + 1;
      bVar4 = iVar3 <= (int)lVar7;
    } while (iVar3 != (int)lVar7);
  }
  return bVar4;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			cmpMask			= reverseBits(getLowBitMask(integerLength));

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	ref		= reverseBits(value);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}